

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

EffectiveSign slang::ast::Expression::conjunction(EffectiveSign left,EffectiveSign right)

{
  if (left != Either) {
    if (right == Either) {
      return left;
    }
    right = (EffectiveSign)(right == Signed && left == Signed);
  }
  return right;
}

Assistant:

Expression::EffectiveSign Expression::conjunction(EffectiveSign left, EffectiveSign right) {
    if (left == EffectiveSign::Either)
        return right;
    if (right == EffectiveSign::Either)
        return left;
    if (left == EffectiveSign::Signed && right == EffectiveSign::Signed)
        return EffectiveSign::Signed;
    return EffectiveSign::Unsigned;
}